

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfIDManifest.cpp
# Opt level: O0

bool __thiscall Imf_3_4::IDManifest::merge(IDManifest *this,IDManifest *other)

{
  bool bVar1;
  bool bVar2;
  size_type sVar3;
  vector<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
  *in_RSI;
  vector<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
  *in_RDI;
  ConstIterator ours;
  ConstIterator it;
  size_t thisManifest;
  bool merged;
  size_t otherManifest;
  bool conflict;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000158;
  uint64_t in_stack_00000160;
  ChannelGroupManifest *in_stack_00000168;
  ChannelGroupManifest *in_stack_ffffffffffffff48;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff50;
  reference in_stack_ffffffffffffff58;
  vector<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
  *in_stack_ffffffffffffff60;
  ulong local_30;
  ulong local_20;
  bool local_11;
  
  local_11 = false;
  for (local_20 = 0;
      sVar3 = std::
              vector<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
              ::size(in_RSI), local_20 < sVar3; local_20 = local_20 + 1) {
    bVar1 = false;
    for (local_30 = 0;
        sVar3 = std::
                vector<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
                ::size(in_RDI), local_30 < sVar3; local_30 = local_30 + 1) {
      std::
      vector<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
      ::operator[](in_RDI,local_30);
      std::
      vector<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
      ::operator[](in_RSI,local_20);
      bVar2 = std::operator==(in_stack_ffffffffffffff50,&in_stack_ffffffffffffff48->_channels);
      if (bVar2) {
        bVar1 = true;
        std::
        vector<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
        ::operator[](in_RSI,local_20);
        std::
        vector<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
        ::operator[](in_RDI,local_30);
        bVar2 = std::operator!=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)in_stack_ffffffffffffff50,
                                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)in_stack_ffffffffffffff48);
        if (bVar2) {
          local_11 = true;
        }
        else {
          std::
          vector<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
          ::operator[](in_RSI,local_20);
          ChannelGroupManifest::begin(in_stack_ffffffffffffff48);
          while( true ) {
            std::
            vector<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
            ::operator[](in_RSI,local_20);
            ChannelGroupManifest::end(in_stack_ffffffffffffff48);
            bVar2 = Imf_3_4::operator!=((ConstIterator *)in_stack_ffffffffffffff50,
                                        (ConstIterator *)in_stack_ffffffffffffff48);
            if (!bVar2) break;
            std::
            vector<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
            ::operator[](in_RDI,local_30);
            ChannelGroupManifest::ConstIterator::id((ConstIterator *)0x1e6353);
            ChannelGroupManifest::find
                      (in_stack_ffffffffffffff58,(uint64_t)in_stack_ffffffffffffff50);
            ChannelGroupManifest::ConstIterator::ConstIterator
                      ((ConstIterator *)in_stack_ffffffffffffff50,
                       (Iterator *)in_stack_ffffffffffffff48);
            std::
            vector<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
            ::operator[](in_RDI,local_30);
            ChannelGroupManifest::end(in_stack_ffffffffffffff48);
            ChannelGroupManifest::ConstIterator::ConstIterator
                      ((ConstIterator *)in_stack_ffffffffffffff50,
                       (Iterator *)in_stack_ffffffffffffff48);
            bVar2 = Imf_3_4::operator==((ConstIterator *)in_stack_ffffffffffffff50,
                                        (ConstIterator *)in_stack_ffffffffffffff48);
            if (bVar2) {
              in_stack_ffffffffffffff58 =
                   std::
                   vector<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
                   ::operator[](in_RDI,local_30);
              in_stack_ffffffffffffff60 =
                   (vector<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
                    *)ChannelGroupManifest::ConstIterator::id((ConstIterator *)0x1e63db);
              ChannelGroupManifest::ConstIterator::text_abi_cxx11_((ConstIterator *)0x1e63ed);
              ChannelGroupManifest::insert(in_stack_00000168,in_stack_00000160,in_stack_00000158);
            }
            else {
              in_stack_ffffffffffffff50 =
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)ChannelGroupManifest::ConstIterator::text_abi_cxx11_
                                ((ConstIterator *)0x1e6410);
              ChannelGroupManifest::ConstIterator::text_abi_cxx11_((ConstIterator *)0x1e6422);
              bVar2 = std::operator!=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)in_stack_ffffffffffffff50,
                                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)in_stack_ffffffffffffff48);
              if (bVar2) {
                local_11 = true;
              }
            }
            ChannelGroupManifest::ConstIterator::operator++
                      ((ConstIterator *)in_stack_ffffffffffffff50);
          }
        }
      }
    }
    if (!bVar1) {
      std::
      vector<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
      ::operator[](in_RSI,local_20);
      std::
      vector<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
      ::push_back(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    }
  }
  return local_11;
}

Assistant:

bool
IDManifest::merge (const IDManifest& other)
{
    bool conflict = false;
    for (size_t otherManifest = 0; otherManifest < other._manifest.size ();
         ++otherManifest)
    {
        bool merged = false;
        for (size_t thisManifest = 0; thisManifest < _manifest.size ();
             ++thisManifest)
        {
            if (_manifest[thisManifest]._channels ==
                other._manifest[otherManifest]._channels)
            {
                // found same channels

                merged = true;

                if (other._manifest[otherManifest]._components !=
                    _manifest[thisManifest]._components)
                {
                    // cannot merge if components are different
                    conflict = true;
                }
                else
                {

                    //                    if(other._manifest[otherManifest]._encodingScheme !=  _manifest[thisManifest]._encodingScheme ||
                    //                        other._manifest[otherManifest]._hashScheme !=  _manifest[thisManifest]._hashScheme ||
                    //                        other._manifest[otherManifest]._hashScheme !=  _manifest[thisManifest]._hashScheme ||
                    //                        other._manifest[otherManifest]._lifeTime !=  _manifest[thisManifest]._lifeTime)
                    //                    {
                    //                        conflict = true;
                    //                    }

                    for (IDManifest::ChannelGroupManifest::ConstIterator it =
                             other._manifest[otherManifest].begin ();
                         it != other._manifest[otherManifest].end ();
                         ++it)
                    {
                        IDManifest::ChannelGroupManifest::ConstIterator ours =
                            _manifest[thisManifest].find (it.id ());
                        if (ours == _manifest[thisManifest].end ())
                        {
                            _manifest[thisManifest].insert (
                                it.id (), it.text ());
                        }
                        else
                        {
                            if (ours.text () != it.text ()) { conflict = true; }
                        }
                    }
                }
            }
        }

        if (!merged) { _manifest.push_back (other._manifest[otherManifest]); }
    }

    return conflict;
}